

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O0

bool __thiscall
TgBot::Api::answerInlineQuery
          (Api *this,string *inlineQueryId,
          vector<std::shared_ptr<TgBot::InlineQueryResult>,_std::allocator<std::shared_ptr<TgBot::InlineQueryResult>_>_>
          *results,int32_t cacheTime,bool isPersonal,string *nextOffset,string *switchPmText,
          string *switchPmParameter)

{
  type_conflict tVar1;
  ulong uVar2;
  bool local_10a [2];
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  allocator local_d1;
  string local_d0;
  ptree local_b0;
  code *local_88;
  undefined8 local_80;
  undefined1 local_78 [8];
  string resultsJson;
  undefined1 local_48 [8];
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> args;
  string *nextOffset_local;
  bool isPersonal_local;
  vector<std::shared_ptr<TgBot::InlineQueryResult>,_std::allocator<std::shared_ptr<TgBot::InlineQueryResult>_>_>
  *pvStack_20;
  int32_t cacheTime_local;
  vector<std::shared_ptr<TgBot::InlineQueryResult>,_std::allocator<std::shared_ptr<TgBot::InlineQueryResult>_>_>
  *results_local;
  string *inlineQueryId_local;
  Api *this_local;
  
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)nextOffset;
  nextOffset_local._3_1_ = isPersonal;
  nextOffset_local._4_4_ = cacheTime;
  pvStack_20 = results;
  results_local =
       (vector<std::shared_ptr<TgBot::InlineQueryResult>,_std::allocator<std::shared_ptr<TgBot::InlineQueryResult>_>_>
        *)inlineQueryId;
  inlineQueryId_local = &this->_token;
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::vector
            ((vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_48);
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::reserve
            ((vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_48,7);
  std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
  emplace_back<char_const(&)[16],std::__cxx11::string_const&>
            ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_48,
             (char (*) [16])"inline_query_id",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)results_local);
  local_88 = TgTypeParser::parseInlineQueryResult_abi_cxx11_;
  local_80 = 0;
  TgTypeParser::parseArray<TgBot::InlineQueryResult>
            ((string *)local_78,(TgTypeParser *)&this->field_0x28,0x359600,
             (vector<std::shared_ptr<TgBot::InlineQueryResult>,_std::allocator<std::shared_ptr<TgBot::InlineQueryResult>_>_>
              *)0x0);
  std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
  emplace_back<char_const(&)[8],std::__cxx11::string&>
            ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_48,
             (char (*) [8])"results",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
  if (nextOffset_local._4_4_ != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[11],int&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_48,
               (char (*) [11])"cache_time",(int *)((long)&nextOffset_local + 4));
  }
  if ((nextOffset_local._3_1_ & 1) != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[12],bool&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_48,
               (char (*) [12])"is_personal",(bool *)((long)&nextOffset_local + 3));
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[12],std::__cxx11::string_const&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_48,
               (char (*) [12])"next_offset",
               &(args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage)->name);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[15],std::__cxx11::string_const&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_48,
               (char (*) [15])"switch_pm_text",switchPmText);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[20],std::__cxx11::string_const&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_48,
               (char (*) [20])"switch_pm_parameter",switchPmParameter);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"answerInlineQuery",&local_d1);
  sendRequest(&local_b0,this,&local_d0,
              (vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_48);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_108,"",0x2e);
  local_10a[0] = false;
  tVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<bool>(&local_b0,&local_108,local_10a);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_108);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree(&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::__cxx11::string::~string((string *)local_78);
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::~vector
            ((vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_48);
  return tVar1;
}

Assistant:

bool Api::answerInlineQuery(const string& inlineQueryId, const std::vector<InlineQueryResult::Ptr>& results,
                            int32_t cacheTime, bool isPersonal, const string& nextOffset, const string& switchPmText, const string& switchPmParameter) const {
    vector<HttpReqArg> args;
    args.reserve(7);
    args.emplace_back("inline_query_id", inlineQueryId);
    string resultsJson = _tgTypeParser.parseArray<InlineQueryResult>(&TgTypeParser::parseInlineQueryResult, results);
    args.emplace_back("results", resultsJson);
    if (cacheTime) {
        args.emplace_back("cache_time", cacheTime);
    }
    if (isPersonal) {
        args.emplace_back("is_personal", isPersonal);
    }
    if (!nextOffset.empty()) {
        args.emplace_back("next_offset", nextOffset);
    }
    if (!switchPmText.empty()) {
        args.emplace_back("switch_pm_text", switchPmText);
    }
    if (!switchPmParameter.empty()) {
        args.emplace_back("switch_pm_parameter", switchPmParameter);
    }
    return sendRequest("answerInlineQuery", args).get<bool>("", false);
}